

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O0

pair<std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
* __thiscall
spvtools::opt::LoopFusion::GetLoadsAndStoresInLoop
          (pair<std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
           *__return_storage_ptr__,LoopFusion *this,Loop *loop)

{
  uint32_t bb_id;
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  BasicBlockListTy *this_00;
  reference pvVar4;
  BasicBlock *this_01;
  Instruction *local_b0;
  Instruction *local_a8;
  Instruction *local_a0;
  Instruction *instruction;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  _Node_iterator_base<unsigned_int,_false> _Stack_68;
  value_type_conflict block_id;
  const_iterator __end2;
  const_iterator __begin2;
  BasicBlockListTy *__range2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> stores;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> loads;
  Loop *loop_local;
  LoopFusion *this_local;
  
  memset(&stores.
          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0x18);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &stores.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  memset(&__range2,0,0x18);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__range2);
  this_00 = Loop::GetBlocks(loop);
  __end2 = std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin(this_00);
  _Stack_68._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(this_00);
  while (bVar1 = std::__detail::operator!=
                           (&__end2.super__Node_iterator_base<unsigned_int,_false>,
                            &stack0xffffffffffffff98), bVar1) {
    pvVar4 = std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*(&__end2);
    bb_id = *pvVar4;
    this_01 = Loop::GetContinueBlock(loop);
    uVar2 = BasicBlock::id(this_01);
    if (bb_id != uVar2) {
      ___begin3 = opt::Function::FindBlock(this->containing_function_,bb_id);
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__begin3);
      BasicBlock::begin((BasicBlock *)&__end3);
      BasicBlock::end((BasicBlock *)&instruction);
      while (bVar1 = utils::operator!=(&__end3.super_iterator,
                                       (iterator_template<spvtools::opt::Instruction> *)&instruction
                                      ), bVar1) {
        local_a0 = utils::IntrusiveList<spvtools::opt::Instruction>::
                   iterator_template<spvtools::opt::Instruction>::operator*(&__end3.super_iterator);
        OVar3 = opt::Instruction::opcode(local_a0);
        if (OVar3 == OpLoad) {
          local_a8 = local_a0;
          std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
          push_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     *)&stores.
                        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_a8);
        }
        else {
          OVar3 = opt::Instruction::opcode(local_a0);
          if (OVar3 == OpStore) {
            local_b0 = local_a0;
            std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ::push_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                         *)&__range2,&local_b0);
          }
        }
        InstructionList::iterator::operator++(&__end3);
      }
    }
    std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++(&__end2);
  }
  std::
  make_pair<std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>&,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>&>
            (__return_storage_ptr__,
             (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &stores.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__range2);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__range2);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &stores.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::vector<Instruction*>, std::vector<Instruction*>>
LoopFusion::GetLoadsAndStoresInLoop(Loop* loop) {
  std::vector<Instruction*> loads{};
  std::vector<Instruction*> stores{};

  for (auto block_id : loop->GetBlocks()) {
    if (block_id == loop->GetContinueBlock()->id()) {
      continue;
    }

    for (auto& instruction : *containing_function_->FindBlock(block_id)) {
      if (instruction.opcode() == spv::Op::OpLoad) {
        loads.push_back(&instruction);
      } else if (instruction.opcode() == spv::Op::OpStore) {
        stores.push_back(&instruction);
      }
    }
  }

  return std::make_pair(loads, stores);
}